

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

int AddToPartition(ON_Mesh *mesh,ON_SimpleArray<int> *pmark,int vi,int partition_mark,int fi0)

{
  ON_SurfaceCurvature *pOVar1;
  int iVar2;
  int iVar3;
  ON_3fPoint *pOVar4;
  ON_3fVector *pOVar5;
  int *piVar6;
  long lVar7;
  ON_2fPoint t;
  ON_3fPoint v;
  ON_3fVector n;
  ON_SurfaceCurvature k;
  int local_84;
  long local_80;
  anon_union_4_2_6147a14e_for_ON_Color_15 local_74;
  ON_2fPoint local_70;
  ON_3fPoint local_68;
  ON_3fVector local_58;
  ON_SurfaceCurvature local_48;
  
  piVar6 = pmark->m_a;
  lVar7 = (long)vi;
  iVar2 = piVar6[lVar7];
  if (iVar2 == 0) {
    piVar6[lVar7] = partition_mark;
  }
  else {
    if (iVar2 == partition_mark) {
      return 0;
    }
    if (iVar2 == partition_mark + -1) {
      return 0;
    }
    if (iVar2 == partition_mark + -2) {
      piVar6[lVar7] = partition_mark + -1;
    }
    else {
      iVar2 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
      pOVar4 = (mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a;
      local_80 = lVar7 * 3;
      local_68.z = pOVar4[lVar7].z;
      pOVar4 = pOVar4 + lVar7;
      local_68.x = pOVar4->x;
      local_68.y = pOVar4->y;
      local_84 = partition_mark;
      ON_SimpleArray<ON_3fPoint>::Append(&(mesh->m_V).super_ON_SimpleArray<ON_3fPoint>,&local_68);
      if ((mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_count == iVar2) {
        pOVar5 = (mesh->m_N).super_ON_SimpleArray<ON_3fVector>.m_a;
        local_58.z = (&pOVar5->z)[local_80];
        local_58._0_8_ = *(undefined8 *)(&pOVar5->x + local_80);
        ON_SimpleArray<ON_3fVector>::Append
                  (&(mesh->m_N).super_ON_SimpleArray<ON_3fVector>,&local_58);
      }
      if ((mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count == iVar2) {
        local_70 = (mesh->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a[lVar7];
        ON_SimpleArray<ON_2fPoint>::Append(&(mesh->m_T).super_ON_SimpleArray<ON_2fPoint>,&local_70);
      }
      if ((mesh->m_K).m_count == iVar2) {
        pOVar1 = (mesh->m_K).m_a + lVar7;
        local_48.k1 = pOVar1->k1;
        local_48.k2 = pOVar1->k2;
        ON_SimpleArray<ON_SurfaceCurvature>::Append(&mesh->m_K,&local_48);
      }
      if ((mesh->m_C).m_count == iVar2) {
        local_74 = (mesh->m_C).m_a[lVar7].field_0;
        ON_SimpleArray<ON_Color>::Append(&mesh->m_C,(ON_Color *)&local_74);
      }
      iVar3 = (mesh->m_F).m_count;
      if (fi0 < iVar3) {
        lVar7 = (long)iVar3 - (long)fi0;
        piVar6 = (mesh->m_F).m_a[fi0].vi + 3;
        do {
          if (((ON_MeshFace *)(piVar6 + -3))->vi[0] == vi) {
            ((ON_MeshFace *)(piVar6 + -3))->vi[0] = iVar2;
          }
          if (piVar6[-2] == vi) {
            piVar6[-2] = iVar2;
          }
          if (piVar6[-1] == vi) {
            piVar6[-1] = iVar2;
          }
          if (*piVar6 == vi) {
            *piVar6 = iVar2;
          }
          piVar6 = piVar6 + 4;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      ON_SimpleArray<int>::Append(pmark,&local_84);
    }
  }
  return 1;
}

Assistant:

static int AddToPartition( ON_Mesh* mesh, ON_SimpleArray<int>& pmark, int vi, int partition_mark, int fi0 )
{
  bool b = true;
  int i, fi, new_vi, face_count, *fvi;
  i = pmark[vi];
  if ( !i ) {
    pmark[vi] = partition_mark;
  }
  else if ( i != partition_mark && i != partition_mark-1 ) {
    if ( i == partition_mark-2 )
      pmark[vi] = partition_mark-1; // vertex vi shared between two partitions
    else {
      new_vi = DupVertex(mesh,vi);
      face_count = mesh->m_F.Count();
      for ( fi = fi0; fi < face_count; fi++ ) {
        fvi = mesh->m_F[fi].vi;
        if ( fvi[0] == vi )
          fvi[0] = new_vi;
        if ( fvi[1] == vi )
          fvi[1] = new_vi;
        if ( fvi[2] == vi )
          fvi[2] = new_vi;
        if ( fvi[3] == vi )
          fvi[3] = new_vi;
      }
      pmark.Append(partition_mark);
    }
  }
  else
    b = false; // vertex already in this partition
  return b;
}